

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_append_708(sei_t *sei,cea708_t *cea708)

{
  int iVar1;
  sei_message_t *msg_00;
  cea708_t *cea708_00;
  size_t size;
  cea708_t *in_RSI;
  sei_t *in_RDI;
  sei_message_t *msg;
  size_t in_stack_ffffffffffffffe0;
  uint8_t *in_stack_ffffffffffffffe8;
  
  msg_00 = sei_message_new((sei_msgtype_t)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8,
                           in_stack_ffffffffffffffe0);
  cea708_00 = (cea708_t *)sei_message_data(msg_00);
  size = sei_message_size(msg_00);
  iVar1 = cea708_render(in_RSI,(uint8_t *)cea708_00,size);
  msg_00->size = (long)iVar1;
  sei_message_append(in_RDI,msg_00);
  cea708_init(cea708_00,(double)in_RSI);
  return;
}

Assistant:

void sei_append_708(sei_t* sei, cea708_t* cea708)
{
    sei_message_t* msg = sei_message_new(sei_type_user_data_registered_itu_t_t35, 0, CEA608_MAX_SIZE);
    msg->size = cea708_render(cea708, sei_message_data(msg), sei_message_size(msg));
    sei_message_append(sei, msg);
    cea708_init(cea708, sei->timestamp); // will confgure using HLS compatiable defaults
}